

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  MockExpectedCallsList *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  MockNamedValue actualParameter;
  MockUnexpectedInputParameterFailure failure;
  undefined1 local_e0 [96];
  TestFailure local_80;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString((SimpleString *)&local_80,"foo");
  iVar3 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_80);
  SimpleString::SimpleString((SimpleString *)(local_e0 + 0x10),"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x58))
            ((long *)CONCAT44(extraout_var,iVar3),local_e0 + 0x10,2);
  SimpleString::~SimpleString((SimpleString *)(local_e0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)&local_80);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)&local_80,"foo");
  iVar3 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_80);
  SimpleString::SimpleString((SimpleString *)(local_e0 + 0x10),"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x88))
            (0x400a666666666666,(long *)CONCAT44(extraout_var_00,iVar3),local_e0 + 0x10);
  SimpleString::~SimpleString((SimpleString *)(local_e0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)&local_80);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)&local_80,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3);
  SimpleString::SimpleString((SimpleString *)&local_80,"bar");
  MockNamedValue::MockNamedValue((MockNamedValue *)(local_e0 + 0x10),(SimpleString *)&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  MockNamedValue::setValue((MockNamedValue *)(local_e0 + 0x10),2);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)local_e0,"foo");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)&local_80,pUVar4,(SimpleString *)local_e0,
             (MockNamedValue *)(local_e0 + 0x10),
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)local_e0);
  pUVar4 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_e0);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_e0);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,
             "Mock Failure: Unexpected parameter name to function \"foo\": bar\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> int boo: <2 (0x2)> (expected 1 call, called 0 times)\n\t\tfoo -> double boo: <3.3> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t<none>\n\tACTUAL unexpected parameter passed to function: foo\n\t\tint bar: <2 (0x2)>"
             ,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0xaf,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_e0);
  TestFailure::~TestFailure(&local_80);
  MockNamedValue::~MockNamedValue((MockNamedValue *)(local_e0 + 0x10));
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedInputParameterFailure)
{
    call1->withName("foo").withParameter("boo", 2);
    call2->withName("foo").withParameter("boo", 3.3);
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue(2);

    MockUnexpectedInputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> int boo: <2 (0x2)> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> double boo: <3.3> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected parameter passed to function: foo\n"
                 "\t\tint bar: <2 (0x2)>", failure.getMessage().asCharString());
}